

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMockExpectedCall::setup(TEST_GROUP_CppUTestGroupMockExpectedCall *this)

{
  MockNamedValueComparatorsAndCopiersRepository *pMVar1;
  MockCheckedExpectedCall *this_00;
  SimpleString local_20;
  
  pMVar1 = MockNamedValue::getDefaultComparatorsAndCopiersRepository();
  this->originalComparatorRepository = pMVar1;
  this_00 = (MockCheckedExpectedCall *)
            operator_new(0xa0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0xa1);
  MockCheckedExpectedCall::MockCheckedExpectedCall(this_00,1);
  this->call = this_00;
  SimpleString::SimpleString(&local_20,"funcName");
  (*(this_00->super_MockExpectedCall)._vptr_MockExpectedCall[2])(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

void setup() _override
    {
        originalComparatorRepository = MockNamedValue::getDefaultComparatorsAndCopiersRepository();
        call = new MockCheckedExpectedCall(1);
        call->withName("funcName");
    }